

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall asmjit::ZoneHeap::_releaseDynamic(ZoneHeap *this,void *p,size_t size)

{
  DynamicBlock *block_00;
  DynamicBlock *pDVar1;
  DynamicBlock *pDVar2;
  bool bVar3;
  long in_RSI;
  ZoneHeap *in_RDI;
  DynamicBlock *next;
  DynamicBlock *prev;
  DynamicBlock *block;
  char *in_stack_000003b0;
  int in_stack_000003bc;
  char *in_stack_000003c0;
  
  if (in_RDI->_zone == (Zone *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  block_00 = *(DynamicBlock **)(in_RSI + -8);
  bVar3 = ZoneHeap_hasDynamicBlock(in_RDI,block_00);
  if (!bVar3) {
    DebugUtils::assertionFailed(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
  }
  pDVar1 = block_00->prev;
  pDVar2 = block_00->next;
  if (pDVar1 == (DynamicBlock *)0x0) {
    in_RDI->_dynamicBlocks = pDVar2;
  }
  else {
    pDVar1->next = pDVar2;
  }
  if (pDVar2 != (DynamicBlock *)0x0) {
    pDVar2->prev = pDVar1;
  }
  free(block_00);
  return;
}

Assistant:

void ZoneHeap::_releaseDynamic(void* p, size_t size) noexcept {
  ASMJIT_ASSERT(isInitialized());
  //printf("RELEASING DYNAMIC %p of size %d\n", p, int(size));

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneHeap_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  Internal::releaseMemory(block);
}